

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_perform_upgrade_tls(Curl_easy *data,connectdata *conn)

{
  _Bool _Var1;
  CURLcode CVar2;
  _Bool local_25;
  CURLcode local_24;
  _Bool ssldone;
  anon_union_280_10_9f9d5394_for_proto *paStack_20;
  CURLcode result;
  pop3_conn *pop3c;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  paStack_20 = &conn->proto;
  local_25 = false;
  pop3c = (pop3_conn *)conn;
  conn_local = (connectdata *)data;
  _Var1 = Curl_conn_is_ssl(conn,0);
  if (!_Var1) {
    CVar2 = Curl_ssl_cfilter_add((Curl_easy *)conn_local,(connectdata *)pop3c,0);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    local_24 = 0;
  }
  local_24 = Curl_conn_connect((Curl_easy *)conn_local,0,false,&local_25);
  if (local_24 == CURLE_OK) {
    *(byte *)((long)paStack_20 + 0xe2) = *(byte *)((long)paStack_20 + 0xe2) & 0xfe | local_25 & 1U;
    if ((paStack_20->pop3c).state != POP3_UPGRADETLS) {
      pop3_state((Curl_easy *)conn_local,POP3_UPGRADETLS);
    }
    if ((*(byte *)((long)paStack_20 + 0xe2) & 1) != 0) {
      pop3_to_pop3s((connectdata *)pop3c);
      local_24 = pop3_perform_capa((Curl_easy *)conn_local,(connectdata *)pop3c);
    }
  }
  return local_24;
}

Assistant:

static CURLcode pop3_perform_upgrade_tls(struct Curl_easy *data,
                                         struct connectdata *conn)
{
  /* Start the SSL connection */
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  CURLcode result;
  bool ssldone = FALSE;

  if(!Curl_conn_is_ssl(conn, FIRSTSOCKET)) {
    result = Curl_ssl_cfilter_add(data, conn, FIRSTSOCKET);
    if(result)
      goto out;
  }

  result = Curl_conn_connect(data, FIRSTSOCKET, FALSE, &ssldone);

  if(!result) {
    pop3c->ssldone = ssldone;
    if(pop3c->state != POP3_UPGRADETLS)
      pop3_state(data, POP3_UPGRADETLS);

    if(pop3c->ssldone) {
      pop3_to_pop3s(conn);
      result = pop3_perform_capa(data, conn);
    }
  }
out:
  return result;
}